

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall tf::TFProfObserver::dump(TFProfObserver *this,ostream *os)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  pointer *ppvVar5;
  pointer pvVar6;
  long lVar7;
  bool bVar8;
  char *pcVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  pvVar6 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_timeline).segments.
                 super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) / 0x18;
  ppvVar5 = (pointer *)
            ((long)&(pvVar6->
                    super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                    )._M_impl.super__Vector_impl_data + 8);
  uVar11 = 0;
  pcVar9 = "{}\n";
  do {
    if (uVar3 == uVar11) {
LAB_00121573:
      std::operator<<(os,pcVar9);
      return;
    }
    if (*ppvVar5 != ((_Vector_impl_data *)(ppvVar5 + -1))->_M_start) {
      if (uVar3 != uVar11) {
        poVar4 = std::operator<<(os,"{\"executor\":\"");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4,"\",\"data\":[");
        pvVar6 = (this->_timeline).segments.
                 super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar8 = false;
        for (; uVar11 < (ulong)(((long)(this->_timeline).segments.
                                       super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6) /
                               0x18); uVar11 = uVar11 + 1) {
          uVar3 = 0;
          while( true ) {
            lVar12 = *(long *)&pvVar6[uVar11].
                               super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                               ._M_impl.super__Vector_impl_data;
            if ((ulong)(((long)*(pointer *)
                                ((long)&pvVar6[uVar11].
                                        super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar12) / 0x18) <=
                uVar3) break;
            lVar7 = uVar3 * 0x18;
            if (*(long *)(lVar12 + lVar7) != *(long *)(lVar12 + 8 + lVar7)) {
              if (bVar8) {
                std::operator<<(os,',');
              }
              poVar4 = std::operator<<(os,"{\"worker\":");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              poVar4 = std::operator<<(poVar4,",\"level\":");
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              std::operator<<(poVar4,",\"data\":[");
              lVar12 = 0;
              uVar10 = 0;
              while( true ) {
                lVar1 = *(long *)&(this->_timeline).segments.
                                  super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                  super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                                  ._M_impl.super__Vector_impl_data;
                lVar2 = *(long *)(lVar1 + lVar7);
                if ((ulong)((*(long *)(lVar1 + 8 + lVar7) - lVar2) / 0x38) <= uVar10) break;
                if (uVar10 != 0) {
                  std::operator<<(os,',');
                }
                poVar4 = std::operator<<(os,"{\"span\":[");
                poVar4 = std::ostream::_M_insert<long>((long)poVar4);
                poVar4 = std::operator<<(poVar4,",");
                poVar4 = std::ostream::_M_insert<long>((long)poVar4);
                std::operator<<(poVar4,"],");
                std::operator<<(os,"\"name\":\"");
                if (*(long *)(lVar2 + 8 + lVar12) == 0) {
                  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
                  poVar4 = std::operator<<(poVar4,'_');
                  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                }
                else {
                  std::operator<<(os,(string *)(lVar2 + lVar12));
                }
                std::operator<<(os,"\",");
                poVar4 = std::operator<<(os,"\"type\":\"");
                pcVar9 = to_string(*(TaskType *)(lVar2 + 0x20 + lVar12));
                poVar4 = std::operator<<(poVar4,pcVar9);
                std::operator<<(poVar4,"\"");
                std::operator<<(os,"}");
                uVar10 = uVar10 + 1;
                lVar12 = lVar12 + 0x38;
              }
              std::operator<<(os,"]}");
              pvVar6 = (this->_timeline).segments.
                       super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              bVar8 = true;
            }
            uVar3 = uVar3 + 1;
          }
        }
        pcVar9 = "]}\n";
      }
      goto LAB_00121573;
    }
    uVar11 = uVar11 + 1;
    ppvVar5 = ppvVar5 + 3;
  } while( true );
}

Assistant:

inline void TFProfObserver::dump(std::ostream& os) const {

  using namespace std::chrono;

  size_t first;

  for(first = 0; first<_timeline.segments.size(); ++first) {
    if(_timeline.segments[first].size() > 0) { 
      break; 
    }
  }
  
  // not timeline data to dump
  if(first == _timeline.segments.size()) {
    os << "{}\n";
    return;
  }

  os << "{\"executor\":\"" << _timeline.uid << "\",\"data\":[";

  bool comma = false;

  for(size_t w=first; w<_timeline.segments.size(); w++) {
    for(size_t l=0; l<_timeline.segments[w].size(); l++) {

      if(_timeline.segments[w][l].empty()) {
        continue;
      }

      if(comma) {
        os << ',';
      }
      else {
        comma = true;
      }

      os << "{\"worker\":" << w << ",\"level\":" << l << ",\"data\":[";
      for(size_t i=0; i<_timeline.segments[w][l].size(); ++i) {

        const auto& s = _timeline.segments[w][l][i];

        if(i) os << ',';
        
        // span 
        os << "{\"span\":[" 
           << duration_cast<microseconds>(s.beg - _timeline.origin).count() 
           << ","
           << duration_cast<microseconds>(s.end - _timeline.origin).count() 
           << "],";
        
        // name
        os << "\"name\":\""; 
        if(s.name.empty()) {
          os << w << '_' << i;
        }
        else {
          os << s.name;
        }
        os << "\",";
    
        // e.g., category "type": "Condition Task"
        os << "\"type\":\"" << to_string(s.type) << "\"";

        os << "}";
      }
      os << "]}";
    }
  }

  os << "]}\n";
}